

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O0

SpatialAcc * __thiscall iDynTree::Axis::getRotationSpatialAcc(Axis *this,double d2theta)

{
  VectorFixSize<3U> *pVVar1;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *other;
  double *dataPtr;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *this_00;
  VectorFixSize<3U> *in_RSI;
  SpatialVector<iDynTree::SpatialMotionVector> *in_RDI;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> orig;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> dir;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> ang;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> lin;
  SpatialAcc *ret;
  SpatialVector<iDynTree::SpatialMotionVector> *this_01;
  PointerArgType in_stack_fffffffffffffef8;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_ffffffffffffff00;
  StorageBaseType *in_stack_ffffffffffffff30;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff38;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff90;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff98;
  
  this_01 = in_RDI;
  SpatialAcc::SpatialAcc((SpatialAcc *)0x62738f);
  pVVar1 = &SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(this_01)->super_Vector3;
  other = (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)this_01);
  Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(Stride<0,_0> *)this_01);
  pVVar1 = &SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(this_01)->super_Vector3;
  dataPtr = VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)this_01);
  Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_ffffffffffffff00,dataPtr,(Stride<0,_0> *)this_01);
  this_00 = (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
            VectorFixSize<3U>::data(in_RSI);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)this_01);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (this_00,dataPtr,(Stride<0,_0> *)this_01);
  VectorFixSize<3U>::data(in_RSI + 1);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)this_01);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (this_00,dataPtr,(Stride<0,_0> *)this_01);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Eigen::operator*((double *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_01,other);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  operator*(in_stack_ffffffffffffff38,(double *)in_stack_ffffffffffffff30);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_01,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)other);
  return (SpatialAcc *)in_RDI;
}

Assistant:

SpatialAcc Axis::getRotationSpatialAcc(const double d2theta) const
    {
        SpatialAcc ret;

        Eigen::Map<Eigen::Vector3d> lin(ret.getLinearVec3().data());
        Eigen::Map<Eigen::Vector3d> ang(ret.getAngularVec3().data());

        Eigen::Map<const Eigen::Vector3d> dir(direction.data());
        Eigen::Map<const Eigen::Vector3d> orig(origin.data());

        lin = d2theta*(orig.cross(dir));
        ang = dir*d2theta;

        return ret;
    }